

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O1

void * dsPtr(uint64_t offset,uint64_t length)

{
  void *pvVar1;
  char *pcVar2;
  char *fmt;
  
  pthread_once(&keyOnce,makeKey);
  pvVar1 = pthread_getspecific(key);
  if (pvVar1 == (void *)0x0) {
    fmt = "%s(): Can\'t get active crate.\n";
    pcVar2 = "dsPtr";
  }
  else {
    if ((*(ulong *)((long)pvVar1 + 0x18) <= offset) &&
       (length + offset <= *(ulong *)((long)pvVar1 + 0x18) + *(long *)((long)pvVar1 + 0x20))) {
      return (void *)(offset + *(long *)((long)pvVar1 + 0x10));
    }
    fmt = "%s(): Can\'t map region outside of crate.\n";
    pcVar2 = "mapObject";
  }
  dsRunLogCallback(fmt,pcVar2);
  return (void *)0x0;
}

Assistant:

void *
dsPtr(uint64_t offset, uint64_t length)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	return mapObject(crate, offset, length);
}